

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall
tetgenmesh::scoutpoint(tetgenmesh *this,point searchpt,triface *searchtet,int randflag)

{
  double dVar1;
  tetgenbehavior *ptVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  memorypool *pmVar7;
  void **ppvVar8;
  undefined1 auVar9 [16];
  locateresult lVar10;
  undefined4 extraout_EAX;
  uint uVar11;
  tetrahedron *pppdVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  tetgenmesh *ptVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double local_88;
  
  if (randflag == 0) {
    if (searchtet->tet == (tetrahedron *)0x0) {
      searchtet->tet = (this->recenttet).tet;
      searchtet->ver = (this->recenttet).ver;
    }
  }
  else {
    randomsample(this,searchpt,searchtet);
  }
  ptVar17 = this;
  lVar10 = locate(this,searchpt,searchtet,0);
  if (lVar10 == OUTSIDE) {
    ptVar2 = this->b;
    if (ptVar2->convex != 0) {
      return 1;
    }
    pppdVar12 = searchtet->tet;
    uVar11 = searchtet->ver;
    ppdVar3 = pppdVar12[orgpivot[(int)uVar11]];
    ppdVar4 = pppdVar12[destpivot[(int)uVar11]];
    ppdVar5 = pppdVar12[apexpivot[(int)uVar11]];
    dVar18 = triarea(ptVar17,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5);
    dVar19 = orient3dfast(ptVar17,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,searchpt);
    local_88 = ptVar2->epsilon;
    if (ABS(dVar19 / dVar18) < local_88) {
      ppdVar3 = pppdVar12[uVar11 & 3];
      uVar14 = (uint)ppdVar3 & 0xf;
      searchtet->ver = uVar14;
      pppdVar12 = (tetrahedron *)((ulong)ppdVar3 & 0xfffffffffffffff0);
      searchtet->tet = pppdVar12;
      iVar15 = fsymtbl[(int)uVar11][uVar14];
      searchtet->ver = iVar15;
      goto LAB_001219fd;
    }
    pmVar7 = this->tetrahedrons;
    ppvVar8 = pmVar7->firstblock;
    pmVar7->pathblock = ppvVar8;
    pmVar7->pathitem =
         (void *)((long)ppvVar8 +
                 (((long)pmVar7->alignbytes + 8U) -
                 (ulong)(ppvVar8 + 1) % (ulong)(long)pmVar7->alignbytes));
    pmVar7->pathitemsleft = pmVar7->itemsperblock;
    do {
      do {
        do {
          do {
            do {
              ptVar17 = this;
              pppdVar12 = tetrahedrontraverse(this);
              searchtet->tet = pppdVar12;
              if (pppdVar12 == (tetrahedron *)0x0) {
                this->nonregularcount = this->nonregularcount + 1;
                return 1;
              }
              iVar15 = searchtet->ver;
              ppdVar3 = pppdVar12[orgpivot[iVar15]];
              ppdVar4 = pppdVar12[destpivot[iVar15]];
              ppdVar5 = pppdVar12[apexpivot[iVar15]];
              ppdVar6 = pppdVar12[oppopivot[iVar15]];
              dVar21 = orient3dfast(ptVar17,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,
                                    (double *)ppdVar6);
            } while (0.0 <= dVar21);
            dVar19 = orient3dfast(ptVar17,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,
                                  searchpt);
            dVar1 = this->b->epsilon;
            dVar19 = (double)(~-(ulong)(ABS(dVar19 / dVar21) < dVar1) & (ulong)dVar19);
          } while (0.0 < dVar19);
          dVar20 = orient3dfast(ptVar17,(double *)ppdVar4,(double *)ppdVar3,(double *)ppdVar6,
                                searchpt);
          dVar20 = (double)(~-(ulong)(ABS(dVar20 / dVar21) < dVar1) & (ulong)dVar20);
        } while (0.0 < dVar20);
        dVar18 = orient3dfast(ptVar17,(double *)ppdVar5,(double *)ppdVar4,(double *)ppdVar6,searchpt
                             );
        dVar18 = (double)(~-(ulong)(ABS(dVar18 / dVar21) < dVar1) & (ulong)dVar18);
      } while (0.0 < dVar18);
      dVar22 = orient3dfast(ptVar17,(double *)ppdVar3,(double *)ppdVar5,(double *)ppdVar6,searchpt);
      dVar22 = (double)(~-(ulong)(ABS(dVar22 / dVar21) < dVar1) & (ulong)dVar22);
    } while (0.0 < dVar22);
    this->nonregularcount = this->nonregularcount + 1;
  }
  else {
    pppdVar12 = searchtet->tet;
    iVar15 = searchtet->ver;
    local_88 = this->b->epsilon;
LAB_001219fd:
    ppdVar3 = pppdVar12[orgpivot[iVar15]];
    ppdVar4 = pppdVar12[destpivot[iVar15]];
    ppdVar5 = pppdVar12[apexpivot[iVar15]];
    ppdVar6 = pppdVar12[oppopivot[iVar15]];
    dVar18 = orient3dfast(ptVar17,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,
                          (double *)ppdVar6);
    dVar19 = orient3dfast(ptVar17,(double *)ppdVar3,(double *)ppdVar4,(double *)ppdVar5,searchpt);
    dVar20 = orient3dfast(ptVar17,(double *)ppdVar4,(double *)ppdVar3,(double *)ppdVar6,searchpt);
    dVar21 = orient3dfast(ptVar17,(double *)ppdVar5,(double *)ppdVar4,(double *)ppdVar6,searchpt);
    dVar22 = orient3dfast(ptVar17,(double *)ppdVar3,(double *)ppdVar5,(double *)ppdVar6,searchpt);
    auVar26._8_8_ = dVar20;
    auVar26._0_8_ = dVar19;
    auVar24._8_8_ = dVar18;
    auVar24._0_8_ = dVar18;
    auVar26 = divpd(auVar26,auVar24);
    auVar23._8_8_ = dVar21;
    auVar23._0_8_ = dVar22;
    auVar9._8_8_ = dVar18;
    auVar9._0_8_ = dVar18;
    auVar24 = divpd(auVar23,auVar9);
    auVar25._8_8_ = -(ulong)(ABS(auVar24._8_8_) < local_88);
    auVar25._0_8_ = -(ulong)(ABS(auVar24._0_8_) < local_88);
    uVar11 = movmskpd(extraout_EAX,auVar25);
    dVar18 = 0.0;
    if ((uVar11 & 2) == 0) {
      dVar18 = dVar21;
    }
    dVar19 = (double)(-(ulong)(local_88 <= ABS(auVar26._0_8_)) & (ulong)dVar19);
    dVar20 = (double)(-(ulong)(local_88 <= ABS(auVar26._8_8_)) & (ulong)dVar20);
    if ((uVar11 & 1) != 0) {
      dVar22 = 0.0;
    }
  }
  if ((dVar19 != 0.0) || (NAN(dVar19))) {
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        if ((dVar22 == 0.0) && (!NAN(dVar22))) {
          iVar15 = eprevtbl[searchtet->ver];
          searchtet->ver = iVar15;
          searchtet->ver = esymtbl[iVar15];
          return 3;
        }
        return 2;
      }
      iVar15 = enexttbl[searchtet->ver];
      searchtet->ver = iVar15;
      iVar15 = esymtbl[iVar15];
      searchtet->ver = iVar15;
      if (dVar22 != 0.0) {
        return 3;
      }
      if (NAN(dVar22)) {
        return 3;
      }
LAB_00121e21:
      lVar13 = (long)iVar15;
      piVar16 = eprevtbl;
    }
    else {
      lVar13 = (long)esymtbl[searchtet->ver];
      searchtet->ver = esymtbl[searchtet->ver];
      if ((dVar18 == 0.0) && (!NAN(dVar18))) {
        searchtet->ver = eprevtbl[lVar13];
        goto LAB_00121b8c;
      }
      if (dVar22 != 0.0) {
        return 3;
      }
      if (NAN(dVar22)) {
        return 3;
      }
LAB_00121e0c:
      piVar16 = enexttbl;
    }
    searchtet->ver = piVar16[lVar13];
    iVar15 = 4;
  }
  else {
    if ((dVar20 != 0.0) || (NAN(dVar20))) {
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        if (dVar22 != 0.0) {
          return 3;
        }
        if (NAN(dVar22)) {
          return 3;
        }
        iVar15 = searchtet->ver;
        goto LAB_00121e21;
      }
      lVar13 = (long)searchtet->ver;
      if ((dVar22 != 0.0) || (NAN(dVar22))) goto LAB_00121e0c;
      piVar16 = eprevtbl;
    }
    else {
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
LAB_00121b8c:
        return (dVar22 == 0.0) + 4;
      }
      lVar13 = (long)searchtet->ver;
      piVar16 = enexttbl;
    }
    searchtet->ver = piVar16[lVar13];
    iVar15 = 5;
  }
  return iVar15;
}

Assistant:

int tetgenmesh::scoutpoint(point searchpt, triface *searchtet, int randflag)
{
  point pa, pb, pc, pd;
  enum locateresult loc = OUTSIDE;
  REAL vol, ori1, ori2 = 0, ori3 = 0, ori4 = 0;
  int t1ver;


  // Randomly select a good starting tet.
  if (randflag) {
    randomsample(searchpt, searchtet);
  } else {
    if (searchtet->tet == NULL) {
      *searchtet = recenttet;
    }
  }
  loc = locate(searchpt, searchtet);

  if (loc == OUTSIDE) {
    if (b->convex) { // -c option
      // The point lies outside of the convex hull.
      return (int) loc;
    }
    // Test if it lies nearly on the hull face.
    // Reuse vol, ori1.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    vol = triarea(pa, pb, pc);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) {
      loc = ONFACE; // On face (or on edge, or on vertex).
      fsymself(*searchtet);
    }
  }

  if (loc != OUTSIDE) {
    // Round the result of location.
    pa = org(*searchtet);
    pb = dest(*searchtet);
    pc = apex(*searchtet);
    pd = oppo(*searchtet);
    vol = orient3dfast(pa, pb, pc, pd);
    ori1 = orient3dfast(pa, pb, pc, searchpt);
    ori2 = orient3dfast(pb, pa, pd, searchpt);
    ori3 = orient3dfast(pc, pb, pd, searchpt);
    ori4 = orient3dfast(pa, pc, pd, searchpt);
    if (fabs(ori1 / vol) < b->epsilon) ori1 = 0;
    if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
    if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
    if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
  } else { // if (loc == OUTSIDE) {
    // Do a brute force search for the point (with rounding).
    tetrahedrons->traversalinit();
    searchtet->tet = tetrahedrontraverse();
    while (searchtet->tet != NULL) {
      pa = org(*searchtet);
      pb = dest(*searchtet);
      pc = apex(*searchtet);
      pd = oppo(*searchtet);

      vol = orient3dfast(pa, pb, pc, pd); 
      if (vol < 0) {
        ori1 = orient3dfast(pa, pb, pc, searchpt);
        if (fabs(ori1 / vol) < b->epsilon) ori1 = 0; // Rounding.
        if (ori1 <= 0) {
          ori2 = orient3dfast(pb, pa, pd, searchpt);
          if (fabs(ori2 / vol) < b->epsilon) ori2 = 0;
          if (ori2 <= 0) {
            ori3 = orient3dfast(pc, pb, pd, searchpt);
            if (fabs(ori3 / vol) < b->epsilon) ori3 = 0;
            if (ori3 <= 0) {
              ori4 = orient3dfast(pa, pc, pd, searchpt);
              if (fabs(ori4 / vol) < b->epsilon) ori4 = 0;
              if (ori4 <= 0) {
                // Found the tet. Return its location. 
                break;
              } // ori4
            } // ori3
          } // ori2
        } // ori1
      }

      searchtet->tet = tetrahedrontraverse();
    } // while (searchtet->tet != NULL)
    nonregularcount++;  // Re-use this counter.
  }

  if (searchtet->tet != NULL) {
    // Return the point location.
    if (ori1 == 0) { // on face [a,b,c]
      if (ori2 == 0) { // on edge [a,b].
        if (ori3 == 0) { // on vertex [b].
          enextself(*searchtet); // [b,c,a,d]
          loc = ONVERTEX;
        } else {
          if (ori4 == 0) { // on vertex [a]
            loc =  ONVERTEX; // [a,b,c,d]
          } else {    
            loc =  ONEDGE; // [a,b,c,d]
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on edge [b,c]
          if (ori4 == 0) { // on vertex [c]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONVERTEX;
          } else {
            enextself(*searchtet); // [b,c,a,d]
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [c,a]
            eprevself(*searchtet); // [c,a,b,d]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      }
    } else { // ori1 != 0
      if (ori2 == 0) { // on face [b,a,d]
        esymself(*searchtet); // [b,a,d,c]
        if (ori3 == 0) { // on edge [b,d]
          eprevself(*searchtet); // [d,b,a,c]
          if (ori4 == 0) { // on vertex [d]                      
            loc =  ONVERTEX;
          } else {
            loc =  ONEDGE;
          }
        } else { // ori3 != 0
          if (ori4 == 0) { // on edge [a,d]
            enextself(*searchtet); // [a,d,b,c]
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        }
      } else { // ori2 != 0
        if (ori3 == 0) { // on face [c,b,d]
          enextself(*searchtet);
          esymself(*searchtet);
          if (ori4 == 0) { // on edge [c,d]
            eprevself(*searchtet);
            loc =  ONEDGE;
          } else {
            loc =  ONFACE;
          }
        } else {
          if (ori4 == 0) { // on face [a,c,d]
            eprevself(*searchtet);
            esymself(*searchtet);
            loc =  ONFACE;
          } else { // inside tet [a,b,c,d]
            loc =  INTETRAHEDRON;
          } // ori4
        } // ori3
      } // ori2
    } // ori1
  } else {
    loc = OUTSIDE;
  }

  return (int) loc;
}